

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O3

usize __thiscall
Console::Prompt::Private::readNextUnbufferedEscapedSequence
          (Private *this,char *buffer,char firschar,char laschar)

{
  code *pcVar1;
  undefined4 in_EAX;
  int iVar2;
  ssize_t sVar3;
  usize uVar4;
  undefined7 in_register_00000011;
  char ch;
  undefined4 uStack_38;
  undefined4 local_34;
  
  _uStack_38 = CONCAT44((int)CONCAT71(in_register_00000011,firschar),in_EAX);
  while( true ) {
    while( true ) {
      sVar3 = read(0,(byte *)((long)&uStack_38 + 3),1);
      if (sVar3 != 1) {
        iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x40a,"read(STDIN_FILENO, &ch, 1) == 1");
        if (iVar2 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      if (uStack_38._3_1_ == '\x1b') break;
      Buffer::append(&this->bufferedInput,(byte *)((long)&uStack_38 + 3),1);
    }
    buffer[0] = '\x1b';
    buffer[1] = '\0';
    uVar4 = readUnbufferedEscapedSequence(this,buffer,buffer + 1);
    if ((buffer[uVar4] == laschar) && (buffer[1] == (char)((ulong)_uStack_38 >> 0x20))) break;
    Buffer::append(&this->bufferedInput,(byte *)buffer,uVar4 + 1);
  }
  return uVar4 + 1;
}

Assistant:

usize readNextUnbufferedEscapedSequence(char* buffer, char firschar, char laschar)
  {
    for(char ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = ch;
        buffer[1] = 0;
        usize len = 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
        char sequenceType = buffer[len - 1];
        if(sequenceType != laschar || buffer[1] != firschar)
        {
          bufferedInput.append((byte*)buffer, len);
          continue;
        }
        return len;
      }
      else
        bufferedInput.append((byte*)&ch, 1);
    }
  }